

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O3

string * __thiscall
cmCPackGenerator::FindTemplate_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackGenerator *this,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCPackLog *pcVar2;
  cmMakefile *this_00;
  _Alloc_hider _Var3;
  bool bVar4;
  size_t sVar5;
  string *psVar6;
  ostream *poVar7;
  char *__s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  ostringstream cmCPackLog_msg;
  string local_1c0;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  size_t local_180;
  char *local_178;
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Look for template: ",0x13);
  __s = "(NULL)";
  if (name != (char *)0x0) {
    __s = name;
  }
  sVar5 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar5);
  std::ios::widen((char)(ostream *)local_1a0 + (char)*(_func_int **)(local_1a0._0_8_ + -0x18));
  std::ostream::put((char)local_1a0);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var3._M_p = local_1c0._M_dataplus._M_p;
  sVar5 = strlen(local_1c0._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x531,_Var3._M_p,sVar5);
  paVar1 = &local_1c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  this_00 = this->MakefileMap;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,name,(allocator<char> *)&local_1c0);
  cmMakefile::GetModulesFile(__return_storage_ptr__,this_00,(string *)local_1a0);
  if ((undefined1 *)local_1a0._0_8_ != local_190) {
    operator_delete((void *)local_1a0._0_8_,local_190._0_8_ + 1);
  }
  if (__return_storage_ptr__->_M_string_length == 0) {
    psVar6 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    local_1a0._8_8_ = (psVar6->_M_dataplus)._M_p;
    local_1a0._0_8_ = psVar6->_M_string_length;
    local_190._0_8_ = 0x18;
    local_190._8_8_ = "/Modules/Internal/CPack/";
    local_180 = strlen(name);
    views._M_len = 3;
    views._M_array = (iterator)local_1a0;
    local_178 = name;
    cmCatViews_abi_cxx11_(&local_1c0,views);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes(__return_storage_ptr__);
    bVar4 = cmsys::SystemTools::FileExists(__return_storage_ptr__);
    if (!bVar4) {
      __return_storage_ptr__->_M_string_length = 0;
      *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Found template: ",0x10);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(__return_storage_ptr__->_M_dataplus)._M_p,
                      __return_storage_ptr__->_M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pcVar2 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var3._M_p = local_1c0._M_dataplus._M_p;
  sVar5 = strlen(local_1c0._M_dataplus._M_p);
  cmCPackLog::Log(pcVar2,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x53e,_Var3._M_p,sVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackGenerator::FindTemplate(const char* name)
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Look for template: " << (name ? name : "(NULL)")
                                      << std::endl);
  // Search CMAKE_MODULE_PATH for a custom template.
  std::string ffile = this->MakefileMap->GetModulesFile(name);
  if (ffile.empty()) {
    // Fall back to our internal builtin default.
    ffile = cmStrCat(cmSystemTools::GetCMakeRoot(), "/Modules/Internal/CPack/",
                     name);
    cmSystemTools::ConvertToUnixSlashes(ffile);
    if (!cmSystemTools::FileExists(ffile)) {
      ffile.clear();
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Found template: " << ffile << std::endl);
  return ffile;
}